

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

CurrentAndNextIter __thiscall
cmConditionEvaluator::cmArgumentList::CurrentAndNextIter::advance
          (CurrentAndNextIter *this,base_t *args)

{
  bool bVar1;
  _List_iterator<cmExpandedCommandArgument> _Var2;
  _Self local_50;
  _List_iterator<cmExpandedCommandArgument> local_48;
  _List_node_base *local_38;
  _List_node_base *local_30;
  list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *local_28;
  base_t *args_local;
  CurrentAndNextIter *this_local;
  
  local_38 = (this->current)._M_node;
  local_28 = args;
  args_local = (base_t *)this;
  local_30 = (_List_node_base *)
             std::next<std::_List_iterator<cmExpandedCommandArgument>>
                       ((_List_iterator<cmExpandedCommandArgument>)local_38,1);
  (this->current)._M_node = local_30;
  local_48._M_node = (this->current)._M_node;
  local_50._M_node =
       (_List_node_base *)
       std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
       end(local_28);
  bVar1 = std::operator!=(&this->current,&local_50);
  _Var2 = std::next<std::_List_iterator<cmExpandedCommandArgument>>(local_48,(ulong)bVar1);
  (this->next)._M_node = _Var2._M_node;
  return *this;
}

Assistant:

CurrentAndNextIter advance(base_t& args)
    {
      this->current = std::next(this->current);
      this->next =
        std::next(this->current,
                  static_cast<difference_type>(this->current != args.end()));
      return *this;
    }